

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O2

void __thiscall QLCDNumber::paintEvent(QLCDNumber *this,QPaintEvent *param_1)

{
  long lVar1;
  QLCDNumberPrivate *this_00;
  byte bVar2;
  QBitArray *newPoints;
  long in_FS_OFFSET;
  QPainter p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLCDNumberPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QFrame).super_QWidget.super_QPaintDevice);
  QFrame::drawFrame(&this->super_QFrame,&p);
  QPainter::setRenderHint((RenderHint)&p,true);
  bVar2 = this_00->field_0x288;
  if ((bVar2 & 0x10) != 0) {
    QPainter::translate(&p,0.5,0.5);
    bVar2 = this_00->field_0x288;
  }
  if ((bVar2 & 4) == 0) {
    newPoints = (QBitArray *)0x0;
  }
  else {
    newPoints = &this_00->points;
  }
  QLCDNumberPrivate::drawString(this_00,&this_00->digitStr,&p,newPoints,false);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLCDNumber::paintEvent(QPaintEvent *)
{
    Q_D(QLCDNumber);
    QPainter p(this);
    drawFrame(&p);
    p.setRenderHint(QPainter::Antialiasing);
    if (d->shadow)
        p.translate(0.5, 0.5);

    if (d->smallPoint)
        d->drawString(d->digitStr, p, &d->points, false);
    else
        d->drawString(d->digitStr, p, nullptr, false);
}